

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_to_refl_coef.c
# Opt level: O0

void WebRtcSpl_LpcToReflCoef(int16_t *a16,int use_order,int16_t *k16)

{
  short sVar1;
  short sVar2;
  int32_t iVar3;
  undefined4 local_108;
  undefined4 local_104;
  int16_t tmp_inv_denom16;
  int32_t tmp_inv_denom32;
  int32_t tmp32 [50];
  int local_28;
  int local_24;
  int k;
  int m;
  int16_t *k16_local;
  int use_order_local;
  int16_t *a16_local;
  
  k16[use_order + -1] = a16[use_order] << 3;
  for (local_24 = use_order + -1; 0 < local_24; local_24 = local_24 + -1) {
    sVar1 = k16[local_24];
    sVar2 = k16[local_24];
    for (local_28 = 1; local_28 <= local_24; local_28 = local_28 + 1) {
      *(int *)(&stack0xffffffffffffff08 + (long)local_28 * 4) =
           a16[local_28] * 0x10000 + (int)k16[local_24] * (int)a16[(local_24 - local_28) + 1] * -2;
      iVar3 = WebRtcSpl_DivW32W16(*(int32_t *)(&stack0xffffffffffffff08 + (long)local_28 * 4),
                                  (int16_t)(0x3fffffff - (int)sVar1 * (int)sVar2 >> 0xf));
      *(int32_t *)(&stack0xffffffffffffff08 + (long)local_28 * 4) = iVar3;
    }
    for (local_28 = 1; local_28 < local_24; local_28 = local_28 + 1) {
      a16[local_28] = (int16_t)(*(int *)(&stack0xffffffffffffff08 + (long)local_28 * 4) >> 1);
    }
    if (*(int *)(&stack0xffffffffffffff08 + (long)local_24 * 4) < 0x2000) {
      if (*(int *)(&stack0xffffffffffffff08 + (long)local_24 * 4) < -0x1fff) {
        local_108 = 0xffffe001;
      }
      else {
        local_108 = *(undefined4 *)(&stack0xffffffffffffff08 + (long)local_24 * 4);
      }
      local_104 = local_108;
    }
    else {
      local_104 = 0x1fff;
    }
    *(undefined4 *)(&stack0xffffffffffffff08 + (long)local_24 * 4) = local_104;
    k16[local_24 + -1] = (int16_t)(*(int *)(&stack0xffffffffffffff08 + (long)local_24 * 4) << 2);
  }
  return;
}

Assistant:

void WebRtcSpl_LpcToReflCoef(int16_t* a16, int use_order, int16_t* k16)
{
    int m, k;
    int32_t tmp32[SPL_LPC_TO_REFL_COEF_MAX_AR_MODEL_ORDER];
    int32_t tmp_inv_denom32;
    int16_t tmp_inv_denom16;

    k16[use_order - 1] = a16[use_order] << 3;  // Q12<<3 => Q15
    for (m = use_order - 1; m > 0; m--)
    {
        // (1 - k^2) in Q30
        tmp_inv_denom32 = 1073741823 - k16[m] * k16[m];
        // (1 - k^2) in Q15
        tmp_inv_denom16 = (int16_t)(tmp_inv_denom32 >> 15);

        for (k = 1; k <= m; k++)
        {
            // tmp[k] = (a[k] - RC[m] * a[m-k+1]) / (1.0 - RC[m]*RC[m]);

            // [Q12<<16 - (Q15*Q12)<<1] = [Q28 - Q28] = Q28
            tmp32[k] = (a16[k] << 16) - (k16[m] * a16[m - k + 1] << 1);

            tmp32[k] = WebRtcSpl_DivW32W16(tmp32[k], tmp_inv_denom16); //Q28/Q15 = Q13
        }

        for (k = 1; k < m; k++)
        {
            a16[k] = (int16_t)(tmp32[k] >> 1);  // Q13>>1 => Q12
        }

        tmp32[m] = WEBRTC_SPL_SAT(8191, tmp32[m], -8191);
        k16[m - 1] = (int16_t)WEBRTC_SPL_LSHIFT_W32(tmp32[m], 2); //Q13<<2 => Q15
    }
    return;
}